

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

_Bool quest_monster_death_check(player *p,monster *mon)

{
  uint32_t *puVar1;
  quest_place *pqVar2;
  level_conflict *plVar3;
  bool bVar4;
  _Bool _Var5;
  wchar_t wVar6;
  quest *pqVar7;
  level_conflict *plVar8;
  wchar_t *pwVar9;
  char *pcVar10;
  quest_place **ppqVar11;
  wchar_t place;
  ulong uVar12;
  loc lVar13;
  ulong uVar14;
  loc lVar15;
  uint uVar16;
  bool bVar17;
  ulong local_58;
  loc local_38;
  
  place = (wchar_t)p->place;
  pqVar7 = find_quest(place);
  if (((pqVar7 == (quest *)0x0) || (mon->race != pqVar7->race)) || (pqVar7->complete != false)) {
    return false;
  }
  wVar6 = pqVar7->cur_num + L'\x01';
  pqVar7->cur_num = wVar6;
  if (wVar6 < pqVar7->max_num) goto LAB_001be6db;
  ppqVar11 = &pqVar7->place;
  do {
    pqVar2 = *ppqVar11;
    ppqVar11 = &pqVar2->next;
  } while (pqVar2->map != (level_map *)world);
  pqVar7->complete = true;
  if (pqVar2->block == true) {
    lVar15.x = (mon->grid).x;
    lVar15.y = (mon->grid).y;
    local_58 = (ulong)lVar15 >> 0x20;
    plVar3 = world->levels;
    lVar13 = lVar15;
    local_38 = lVar15;
    if (plVar3[place].down != (char *)0x0) {
      _Var5 = square_changeable(cave,lVar15);
      if ((_Var5) || (_Var5 = square_ispassable(cave,lVar15), !_Var5)) {
        lVar13 = (loc)((ulong)lVar15 & 0xffffffff);
      }
      else {
        _Var5 = square_isdoor(cave,lVar15);
        if (_Var5) {
          lVar13 = (loc)((ulong)lVar15 & 0xffffffff);
        }
        else {
          do {
            scatter(cave,&local_38,lVar15,L'\x01',false);
            lVar15 = local_38;
            lVar13 = (loc)((ulong)local_38 & 0xffffffff);
            local_58 = (ulong)local_38 >> 0x20;
            _Var5 = square_changeable(cave,local_38);
            if ((_Var5) || (_Var5 = square_ispassable(cave,lVar15), !_Var5)) break;
            _Var5 = square_isdoor(cave,lVar15);
          } while (!_Var5);
        }
      }
      push_object(lVar15);
      msg("A magical staircase appears...");
      square_set_feat(cave,lVar15,FEAT_MORE);
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 0xc0;
    }
    uVar14 = (ulong)lVar13 & 0xffffffff;
    bVar17 = plVar3[place].north != (char *)0x0;
    if (bVar17) {
      plVar8 = level_by_name(world,plVar3[place].north);
      uVar12 = local_58;
      if (1 < (int)local_58) {
        lVar15 = (loc)(local_58 << 0x20 | uVar14);
        do {
          _Var5 = square_ispermanent(cave,lVar15);
          if (_Var5) goto LAB_001be42c;
          square_set_feat(cave,lVar15,FEAT_ROAD);
          lVar15 = (loc)((long)lVar15 + -0x100000000);
          bVar4 = 2 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar4);
        uVar12 = 1;
      }
LAB_001be42c:
      if (plVar3[place].depth < plVar8->depth) {
        pwVar9 = &FEAT_MORE_NORTH;
      }
      else {
        pwVar9 = &FEAT_LESS_NORTH;
      }
      square_set_feat(cave,(loc)(uVar14 + (uVar12 << 0x20)),*pwVar9);
    }
    wVar6 = lVar13.x;
    if (plVar3[place].east != (char *)0x0) {
      plVar8 = level_by_name(world,plVar3[place].east);
      uVar12 = (ulong)lVar13 & 0xffffffff;
      if (wVar6 < cave->width + L'\xfffffffe') {
        uVar12 = (ulong)lVar13 & 0xffffffff;
        do {
          lVar15 = (loc)(uVar12 | local_58 << 0x20);
          _Var5 = square_ispermanent(cave,lVar15);
          if (_Var5) break;
          square_set_feat(cave,lVar15,FEAT_ROAD);
          uVar16 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar16;
        } while ((int)uVar16 < cave->width + -2);
      }
      if (plVar3[place].depth < plVar8->depth) {
        pwVar9 = &FEAT_MORE_EAST;
      }
      else {
        pwVar9 = &FEAT_LESS_EAST;
      }
      square_set_feat(cave,(loc)(uVar12 | local_58 << 0x20),*pwVar9);
      bVar17 = true;
    }
    if (plVar3[place].south != (char *)0x0) {
      plVar8 = level_by_name(world,plVar3[place].south);
      uVar12 = local_58;
      if ((int)local_58 < cave->height + -2) {
        do {
          lVar15 = (loc)(uVar12 << 0x20 | uVar14);
          _Var5 = square_ispermanent(cave,lVar15);
          if (_Var5) break;
          square_set_feat(cave,lVar15,FEAT_ROAD);
          uVar16 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar16;
        } while ((int)uVar16 < cave->height + -2);
      }
      if (plVar3[place].depth < plVar8->depth) {
        pwVar9 = &FEAT_MORE_SOUTH;
      }
      else {
        pwVar9 = &FEAT_LESS_SOUTH;
      }
      square_set_feat(cave,(loc)(uVar14 + (uVar12 << 0x20)),*pwVar9);
      bVar17 = true;
    }
    if (plVar3[place].west == (char *)0x0) {
      if (!bVar17) goto LAB_001be6d0;
    }
    else {
      plVar8 = level_by_name(world,plVar3[place].west);
      if (L'\x01' < wVar6) {
        do {
          lVar15 = (loc)(uVar14 + (local_58 << 0x20));
          _Var5 = square_ispermanent(cave,lVar15);
          if (_Var5) {
            wVar6 = (wchar_t)uVar14;
            goto LAB_001be67e;
          }
          square_set_feat(cave,lVar15,FEAT_ROAD);
          bVar17 = 2 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar17);
        wVar6 = L'\x01';
      }
LAB_001be67e:
      if (plVar3[place].depth < plVar8->depth) {
        pwVar9 = &FEAT_MORE_WEST;
      }
      else {
        pwVar9 = &FEAT_LESS_WEST;
      }
      square_set_feat(cave,(loc)((ulong)(uint)wVar6 | local_58 << 0x20),*pwVar9);
    }
    pcVar10 = locality_name(plVar3[place].locality);
    msg("The way out of %s is revealed!",pcVar10);
  }
LAB_001be6d0:
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 0x20;
LAB_001be6db:
  if ((pqVar7->type == L'\x03') && (pqVar7->complete == true)) {
    p->total_winner = 1;
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 2;
    msg("*** CONGRATULATIONS ***");
    msg("You have won the game!");
    msg("You may retire (key is shift-q) when you are ready.");
  }
  return true;
}

Assistant:

bool quest_monster_death_check(struct player *p, const struct monster *mon)
{
	struct quest *quest = find_quest(p->place);

	/* Simple checks */
	if (!quest) return false;
	if ((mon->race != quest->race) || quest->complete) return false;

	/* Increment count, check for completion */
	quest->cur_num++;
	if (quest->cur_num >= quest->max_num) {
		struct quest_place *place = find_quest_place(quest);
		quest->complete = true;

		/* Build magical stairs if needed */
		if (place->block) {
			build_quest_stairs(p, mon->grid);
		}

		/* Check specialties */
		p->upkeep->update |= (PU_SPECIALTY);
	}

	/* Game over... */
	if ((quest->type == QUEST_FINAL) && quest->complete) {
		p->total_winner = true;
		p->upkeep->redraw |= (PR_TITLE);
		msg("*** CONGRATULATIONS ***");
		msg("You have won the game!");
		msg("You may retire (key is shift-q) when you are ready.");
	}

	return true;
}